

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void output_base(void)

{
  int local_10;
  int local_c;
  int j;
  int i;
  
  if (rflag == '\0') {
    fprintf((FILE *)output_file,"static ");
  }
  fprintf((FILE *)output_file,"int %ssindex[] = {%39d,",symbol_prefix,(ulong)(uint)*base);
  local_10 = 10;
  for (local_c = 1; local_c < nstates; local_c = local_c + 1) {
    if (local_10 < 10) {
      local_10 = local_10 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      local_10 = 1;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)(uint)base[local_c]);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fprintf((FILE *)output_file,"\n};\n");
  if (rflag == '\0') {
    fprintf((FILE *)output_file,"static ");
  }
  fprintf((FILE *)output_file,"int %srindex[] = {%39d,",symbol_prefix,(ulong)(uint)base[nstates]);
  local_10 = 10;
  local_c = nstates;
  while (local_c = local_c + 1, SBORROW4(local_c,nstates * 2) != local_c + nstates * -2 < 0) {
    if (local_10 < 10) {
      local_10 = local_10 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      local_10 = 1;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)(uint)base[local_c]);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fprintf((FILE *)output_file,"\n};\n");
  if (rflag == '\0') {
    fprintf((FILE *)output_file,"static ");
  }
  fprintf((FILE *)output_file,"int %scindex[] = {%39d,",symbol_prefix,
          (ulong)(uint)base[nstates << 1]);
  local_10 = 10;
  local_c = nstates * 2;
  while (local_c = local_c + 1, SBORROW4(local_c,nstates * 3) != local_c + nstates * -3 < 0) {
    if (local_10 < 10) {
      local_10 = local_10 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      local_10 = 1;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)(uint)base[local_c]);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fprintf((FILE *)output_file,"\n};\n");
  if (rflag == '\0') {
    fprintf((FILE *)output_file,"static ");
  }
  fprintf((FILE *)output_file,"int %sgindex[] = {%39d,",symbol_prefix,(ulong)(uint)base[nstates * 3]
         );
  local_10 = 10;
  local_c = nstates * 3;
  while (local_c = local_c + 1, local_c < nvectors + -1) {
    if (local_10 < 10) {
      local_10 = local_10 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      local_10 = 1;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)(uint)base[local_c]);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fprintf((FILE *)output_file,"\n};\n");
  free(base);
  return;
}

Assistant:

void output_base()
{
    register int i, j;

    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %ssindex[] = {%39d,", symbol_prefix, base[0]);
    j = 10;
    for (i = 1; i < nstates; i++) {
	if (j >= 10) {
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1; }
	else
	    ++j;
	fprintf(output_file, "%5d,", base[i]); }

    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %srindex[] = {%39d,", symbol_prefix, base[nstates]);
    j = 10;
    for (i = nstates + 1; i < 2*nstates; i++) {
	if (j >= 10) {
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1; }
	else
	    ++j;
	fprintf(output_file, "%5d,", base[i]); }

    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %scindex[] = {%39d,", symbol_prefix, base[2*nstates]);
    j = 10;
    for (i = 2*nstates + 1; i < 3*nstates; i++) {
	if (j >= 10) {
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1; }
	else
	    ++j;
	fprintf(output_file, "%5d,", base[i]); }


    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %sgindex[] = {%39d,", symbol_prefix,
	    base[3*nstates]);
    j = 10;
    for (i = 3*nstates + 1; i < nvectors - 1; i++) {
	if (j >= 10) {
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1; }
	else
	    ++j;
	fprintf(output_file, "%5d,", base[i]); }

    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    FREE(base);
}